

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderWindowTitleBarContents
               (ImGuiWindow *window,ImRect *title_bar_rect,char *name,bool *p_open)

{
  ImVec2 *pIVar1;
  uint uVar2;
  ImGuiItemFlags IVar3;
  ImGuiContext *pIVar4;
  ImGuiID IVar5;
  float fVar6;
  bool bVar7;
  float fVar8;
  float local_10c;
  ImVec2 local_104;
  ImVec2 local_fc;
  ImVec2 local_f4;
  ImVec2 local_ec;
  ImVec2 off;
  ImVec2 local_dc;
  ImVec2 local_d4;
  ImVec2 marker_pos;
  ImRect clip_r;
  ImRect layout_r;
  float pad_extend;
  float centerness;
  ImVec2 local_9c;
  ImVec2 local_94;
  ImVec2 text_size;
  float marker_size_x;
  char *UNSAVED_DOCUMENT_MARKER;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 collapse_button_pos;
  ImVec2 close_button_pos;
  float button_sz;
  float pad_r;
  float pad_l;
  ImGuiItemFlags item_flags_backup;
  bool has_collapse_button;
  bool has_close_button;
  ImGuiWindowFlags flags;
  ImGuiStyle *style;
  ImGuiContext *g;
  bool *p_open_local;
  char *name_local;
  ImRect *title_bar_rect_local;
  ImGuiWindow *window_local;
  
  pIVar4 = GImGui;
  uVar2 = window->Flags;
  bVar7 = false;
  if ((uVar2 & 0x20) == 0) {
    bVar7 = (GImGui->Style).WindowMenuButtonPosition != -1;
  }
  IVar3 = (window->DC).ItemFlags;
  (window->DC).ItemFlags = (window->DC).ItemFlags | 0x10;
  (window->DC).NavLayerCurrent = ImGuiNavLayer_Menu;
  button_sz = (pIVar4->Style).FramePadding.x;
  close_button_pos.y = (pIVar4->Style).FramePadding.x;
  fVar6 = pIVar4->FontSize;
  ImVec2::ImVec2(&collapse_button_pos);
  ImVec2::ImVec2(&local_60);
  if (p_open != (bool *)0x0) {
    close_button_pos.y = fVar6 + close_button_pos.y;
    ImVec2::ImVec2(&local_68,
                   ((title_bar_rect->Max).x - close_button_pos.y) - (pIVar4->Style).FramePadding.x,
                   (title_bar_rect->Min).y);
    collapse_button_pos = local_68;
  }
  if ((bVar7) && ((pIVar4->Style).WindowMenuButtonPosition == 1)) {
    close_button_pos.y = fVar6 + close_button_pos.y;
    ImVec2::ImVec2(&local_70,
                   ((title_bar_rect->Max).x - close_button_pos.y) - (pIVar4->Style).FramePadding.x,
                   (title_bar_rect->Min).y);
    local_60 = local_70;
  }
  if ((bVar7) && ((pIVar4->Style).WindowMenuButtonPosition == 0)) {
    ImVec2::ImVec2((ImVec2 *)&UNSAVED_DOCUMENT_MARKER,
                   ((title_bar_rect->Min).x + button_sz) - (pIVar4->Style).FramePadding.x,
                   (title_bar_rect->Min).y);
    local_60 = (ImVec2)UNSAVED_DOCUMENT_MARKER;
    button_sz = fVar6 + button_sz;
  }
  if (bVar7) {
    IVar5 = ImGuiWindow::GetID(window,"#COLLAPSE",(char *)0x0);
    bVar7 = CollapseButton(IVar5,&local_60);
    if (bVar7) {
      window->WantCollapseToggle = true;
    }
  }
  if (p_open != (bool *)0x0) {
    IVar5 = ImGuiWindow::GetID(window,"#CLOSE",(char *)0x0);
    bVar7 = CloseButton(IVar5,&collapse_button_pos);
    if (bVar7) {
      *p_open = false;
    }
  }
  (window->DC).NavLayerCurrent = ImGuiNavLayer_Main;
  (window->DC).ItemFlags = IVar3;
  if ((uVar2 & 0x100000) == 0) {
    local_10c = 0.0;
  }
  else {
    text_size = CalcTextSize("*",(char *)0x0,false,-1.0);
    local_10c = text_size.x;
  }
  local_9c = CalcTextSize(name,(char *)0x0,true,-1.0);
  ImVec2::ImVec2((ImVec2 *)&pad_extend,local_10c,0.0);
  local_94 = operator+(&local_9c,(ImVec2 *)&pad_extend);
  pIVar1 = &(pIVar4->Style).FramePadding;
  if (pIVar1->x <= button_sz && button_sz != pIVar1->x) {
    button_sz = (pIVar4->Style).ItemInnerSpacing.x + button_sz;
  }
  pIVar1 = &(pIVar4->Style).FramePadding;
  if (pIVar1->x <= close_button_pos.y && close_button_pos.y != pIVar1->x) {
    close_button_pos.y = (pIVar4->Style).ItemInnerSpacing.x + close_button_pos.y;
  }
  if ((0.0 < (pIVar4->Style).WindowTitleAlign.x) &&
     (pIVar1 = &(pIVar4->Style).WindowTitleAlign, pIVar1->x <= 1.0 && pIVar1->x != 1.0)) {
    fVar6 = -ABS((pIVar4->Style).WindowTitleAlign.x - 0.5);
    layout_r.Max.y = ImSaturate(fVar6 + fVar6 + 1.0);
    fVar6 = ImMax<float>(button_sz,close_button_pos.y);
    fVar8 = ImRect::GetWidth(title_bar_rect);
    layout_r.Max.x = ImMin<float>(fVar6,((fVar8 - button_sz) - close_button_pos.y) - local_94.x);
    button_sz = ImMax<float>(button_sz,layout_r.Max.x * layout_r.Max.y);
    close_button_pos.y = ImMax<float>(close_button_pos.y,layout_r.Max.x * layout_r.Max.y);
  }
  ImRect::ImRect((ImRect *)&clip_r.Max,(title_bar_rect->Min).x + button_sz,(title_bar_rect->Min).y,
                 (title_bar_rect->Max).x - close_button_pos.y,(title_bar_rect->Max).y);
  ImRect::ImRect((ImRect *)&marker_pos,clip_r.Max.x,clip_r.Max.y,
                 layout_r.Min.x + (pIVar4->Style).ItemInnerSpacing.x,layout_r.Min.y);
  RenderTextClipped(&clip_r.Max,&layout_r.Min,name,(char *)0x0,&local_94,
                    &(pIVar4->Style).WindowTitleAlign,(ImRect *)&marker_pos);
  if ((uVar2 & 0x100000) != 0) {
    fVar6 = ImRect::GetWidth((ImRect *)&clip_r.Max);
    fVar6 = ImMax<float>(clip_r.Max.x,
                         (fVar6 - local_94.x) * (pIVar4->Style).WindowTitleAlign.x + clip_r.Max.x);
    ImVec2::ImVec2(&local_dc,fVar6 + local_94.x,clip_r.Max.y);
    ImVec2::ImVec2(&off,2.0 - local_10c,0.0);
    local_d4 = operator+(&local_dc,&off);
    ImVec2::ImVec2(&local_ec,0.0,(float)(int)(pIVar4->FontSize * -0.25));
    local_f4 = operator+(&local_d4,&local_ec);
    local_fc = operator+(&layout_r.Min,&local_ec);
    ImVec2::ImVec2(&local_104,0.0,(pIVar4->Style).WindowTitleAlign.y);
    RenderTextClipped(&local_f4,&local_fc,"*",(char *)0x0,(ImVec2 *)0x0,&local_104,
                      (ImRect *)&marker_pos);
  }
  return;
}

Assistant:

void ImGui::RenderWindowTitleBarContents(ImGuiWindow* window, const ImRect& title_bar_rect, const char* name, bool* p_open)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImGuiWindowFlags flags = window->Flags;

    const bool has_close_button = (p_open != NULL);
    const bool has_collapse_button = !(flags & ImGuiWindowFlags_NoCollapse) && (style.WindowMenuButtonPosition != ImGuiDir_None);

    // Close & Collapse button are on the Menu NavLayer and don't default focus (unless there's nothing else on that layer)
    const ImGuiItemFlags item_flags_backup = window->DC.ItemFlags;
    window->DC.ItemFlags |= ImGuiItemFlags_NoNavDefaultFocus;
    window->DC.NavLayerCurrent = ImGuiNavLayer_Menu;

    // Layout buttons
    // FIXME: Would be nice to generalize the subtleties expressed here into reusable code.
    float pad_l = style.FramePadding.x;
    float pad_r = style.FramePadding.x;
    float button_sz = g.FontSize;
    ImVec2 close_button_pos;
    ImVec2 collapse_button_pos;
    if (has_close_button)
    {
        pad_r += button_sz;
        close_button_pos = ImVec2(title_bar_rect.Max.x - pad_r - style.FramePadding.x, title_bar_rect.Min.y);
    }
    if (has_collapse_button && style.WindowMenuButtonPosition == ImGuiDir_Right)
    {
        pad_r += button_sz;
        collapse_button_pos = ImVec2(title_bar_rect.Max.x - pad_r - style.FramePadding.x, title_bar_rect.Min.y);
    }
    if (has_collapse_button && style.WindowMenuButtonPosition == ImGuiDir_Left)
    {
        collapse_button_pos = ImVec2(title_bar_rect.Min.x + pad_l - style.FramePadding.x, title_bar_rect.Min.y);
        pad_l += button_sz;
    }

    // Collapse button (submitting first so it gets priority when choosing a navigation init fallback)
    if (has_collapse_button)
        if (CollapseButton(window->GetID("#COLLAPSE"), collapse_button_pos))
            window->WantCollapseToggle = true; // Defer actual collapsing to next frame as we are too far in the Begin() function

    // Close button
    if (has_close_button)
        if (CloseButton(window->GetID("#CLOSE"), close_button_pos))
            *p_open = false;

    window->DC.NavLayerCurrent = ImGuiNavLayer_Main;
    window->DC.ItemFlags = item_flags_backup;

    // Title bar text (with: horizontal alignment, avoiding collapse/close button, optional "unsaved document" marker)
    // FIXME: Refactor text alignment facilities along with RenderText helpers, this is WAY too much messy code..
    const char* UNSAVED_DOCUMENT_MARKER = "*";
    const float marker_size_x = (flags & ImGuiWindowFlags_UnsavedDocument) ? CalcTextSize(UNSAVED_DOCUMENT_MARKER, NULL, false).x : 0.0f;
    const ImVec2 text_size = CalcTextSize(name, NULL, true) + ImVec2(marker_size_x, 0.0f);

    // As a nice touch we try to ensure that centered title text doesn't get affected by visibility of Close/Collapse button,
    // while uncentered title text will still reach edges correct.
    if (pad_l > style.FramePadding.x)
        pad_l += g.Style.ItemInnerSpacing.x;
    if (pad_r > style.FramePadding.x)
        pad_r += g.Style.ItemInnerSpacing.x;
    if (style.WindowTitleAlign.x > 0.0f && style.WindowTitleAlign.x < 1.0f)
    {
        float centerness = ImSaturate(1.0f - ImFabs(style.WindowTitleAlign.x - 0.5f) * 2.0f); // 0.0f on either edges, 1.0f on center
        float pad_extend = ImMin(ImMax(pad_l, pad_r), title_bar_rect.GetWidth() - pad_l - pad_r - text_size.x);
        pad_l = ImMax(pad_l, pad_extend * centerness);
        pad_r = ImMax(pad_r, pad_extend * centerness);
    }

    ImRect layout_r(title_bar_rect.Min.x + pad_l, title_bar_rect.Min.y, title_bar_rect.Max.x - pad_r, title_bar_rect.Max.y);
    ImRect clip_r(layout_r.Min.x, layout_r.Min.y, layout_r.Max.x + g.Style.ItemInnerSpacing.x, layout_r.Max.y);
    //if (g.IO.KeyCtrl) window->DrawList->AddRect(layout_r.Min, layout_r.Max, IM_COL32(255, 128, 0, 255)); // [DEBUG]
    RenderTextClipped(layout_r.Min, layout_r.Max, name, NULL, &text_size, style.WindowTitleAlign, &clip_r);
    if (flags & ImGuiWindowFlags_UnsavedDocument)
    {
        ImVec2 marker_pos = ImVec2(ImMax(layout_r.Min.x, layout_r.Min.x + (layout_r.GetWidth() - text_size.x) * style.WindowTitleAlign.x) + text_size.x, layout_r.Min.y) + ImVec2(2 - marker_size_x, 0.0f);
        ImVec2 off = ImVec2(0.0f, IM_FLOOR(-g.FontSize * 0.25f));
        RenderTextClipped(marker_pos + off, layout_r.Max + off, UNSAVED_DOCUMENT_MARKER, NULL, NULL, ImVec2(0, style.WindowTitleAlign.y), &clip_r);
    }
}